

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O1

void duckdb::FSSTStorage::Compress(CompressionState *state_p,Vector *scan_vector,idx_t count)

{
  uint uVar1;
  duckdb_fsst_encoder_t *encoder;
  uchar *compressed_string;
  anon_struct_16_3_d7536bce_for_pointer uncompressed_string;
  reference pvVar2;
  reference ppuVar3;
  reference output;
  reference lenOut;
  reference strOut;
  size_t sVar4;
  ulong uVar5;
  FatalException *pFVar6;
  uint *puVar7;
  size_type __n;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  size_type __n_00;
  size_type __n_01;
  allocator_type local_139;
  FSSTCompressionState *local_138;
  ulong local_130;
  string local_128;
  vector<unsigned_char_*,_true> strings_in;
  vector<unsigned_long,_true> sizes_in;
  vector<unsigned_long,_true> sizes_out;
  vector<unsigned_char,_true> compress_buffer;
  vector<unsigned_char_*,_true> strings_out;
  UnifiedVectorFormat vdata;
  
  local_138 = (FSSTCompressionState *)state_p;
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  Vector::ToUnifiedFormat(scan_vector,count,&vdata);
  __n_01 = 0;
  sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
  super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_130 = count;
  if (count == 0) {
    __n = 7;
  }
  else {
    lVar10 = 0;
    __n_01 = 0;
    uVar9 = 0;
    do {
      uVar8 = uVar9;
      if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)(vdata.sel)->sel_vector[uVar9];
      }
      if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6] >>
           (uVar8 & 0x3f) & 1) != 0)) {
        uVar1 = *(uint *)(vdata.data + uVar8 * 0x10);
        if ((ulong)uVar1 != 0) {
          puVar7 = (uint *)(vdata.data + uVar8 * 0x10);
          local_128._M_dataplus._M_p = (pointer)(ulong)*puVar7;
          if (sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sizes_in,
                       (iterator)
                       sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,(unsigned_long *)&local_128);
          }
          else {
            *sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)local_128._M_dataplus._M_p;
            sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          if (*puVar7 < 0xd) {
            local_128._M_dataplus._M_p = (pointer)(puVar7 + 1);
          }
          else {
            local_128._M_dataplus._M_p = *(pointer *)(puVar7 + 2);
          }
          if (strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
              super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
            _M_realloc_insert<unsigned_char*>
                      ((vector<unsigned_char*,std::allocator<unsigned_char*>> *)&strings_in,
                       (iterator)
                       strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl
                       .super__Vector_impl_data._M_finish,(uchar **)&local_128);
          }
          else {
            *strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
             super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
             super__Vector_impl_data._M_finish = (uchar *)local_128._M_dataplus._M_p;
            strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
            super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                 super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          __n_01 = __n_01 + 1;
          lVar10 = lVar10 + (ulong)uVar1;
        }
      }
      uVar9 = uVar9 + 1;
    } while (local_130 != uVar9);
    __n = lVar10 * 2 + 7;
  }
  uVar9 = local_130;
  if (__n_01 == 0) {
    if (local_130 != 0) {
      uVar8 = 0;
      do {
        uVar5 = uVar8;
        if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar5 = (ulong)(vdata.sel)->sel_vector[uVar8];
        }
        if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar5 >> 6] >>
             (uVar5 & 0x3f) & 1) != 0)) {
          if (*(int *)(vdata.data + uVar5 * 0x10) != 0) {
            pFVar6 = (FatalException *)__cxa_allocate_exception(0x10);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,
                       "FSST: no encoder found even though there are values to encode","");
            FatalException::FatalException(pFVar6,FATAL,&local_128);
            __cxa_throw(pFVar6,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          FSSTCompressionState::AddEmptyString(local_138);
        }
        else {
          FSSTCompressionState::AddNull(local_138);
        }
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
  }
  else {
    local_128._M_dataplus._M_p = (pointer)0x0;
    ::std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector
              (&strings_out.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>,__n_01,
               (value_type *)&local_128,(allocator_type *)&sizes_out);
    local_128._M_dataplus._M_p = (pointer)0x0;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&sizes_out,__n_01,
               (value_type_conflict2 *)&local_128,(allocator_type *)&compress_buffer);
    local_128._M_dataplus._M_p = local_128._M_dataplus._M_p & 0xffffffffffffff00;
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&compress_buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,__n,
               (value_type_conflict4 *)&local_128,&local_139);
    encoder = local_138->fsst_encoder;
    pvVar2 = vector<unsigned_long,_true>::operator[](&sizes_in,0);
    ppuVar3 = vector<unsigned_char_*,_true>::operator[](&strings_in,0);
    output = vector<unsigned_char,_true>::operator[](&compress_buffer,0);
    lenOut = vector<unsigned_long,_true>::operator[](&sizes_out,0);
    strOut = vector<unsigned_char_*,_true>::operator[](&strings_out,0);
    sVar4 = duckdb_fsst_compress(encoder,__n_01,pvVar2,ppuVar3,__n,output,lenOut,strOut);
    if (sVar4 != __n_01) {
      pFVar6 = (FatalException *)__cxa_allocate_exception(0x10);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"FSST compression failed to compress all strings","");
      FatalException::FatalException(pFVar6,FATAL,&local_128);
      __cxa_throw(pFVar6,&FatalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (local_130 != 0) {
      uVar9 = 0;
      __n_00 = 0;
      do {
        uVar8 = uVar9;
        if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)(vdata.sel)->sel_vector[uVar9];
        }
        if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6] >>
             (uVar8 & 0x3f) & 1) != 0)) {
          if (*(int *)(vdata.data + uVar8 * 0x10) == 0) {
            FSSTCompressionState::AddEmptyString(local_138);
          }
          else {
            uncompressed_string =
                 ((anon_union_16_2_67f50693_for_value *)(vdata.data + uVar8 * 0x10))->pointer;
            ppuVar3 = vector<unsigned_char_*,_true>::operator[](&strings_out,__n_00);
            compressed_string = *ppuVar3;
            pvVar2 = vector<unsigned_long,_true>::operator[](&sizes_out,__n_00);
            FSSTCompressionState::UpdateState
                      (local_138,(string_t)uncompressed_string,compressed_string,*pvVar2);
            __n_00 = __n_00 + 1;
          }
        }
        else {
          FSSTCompressionState::AddNull(local_138);
        }
        uVar9 = uVar9 + 1;
      } while (local_130 != uVar9);
    }
    if (compress_buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(compress_buffer.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (sizes_out.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(sizes_out.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (strings_out.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
        super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(strings_out.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                      super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
      super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(strings_in.super_vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                    super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sizes_in.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (vdata.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (vdata.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void FSSTStorage::Compress(CompressionState &state_p, Vector &scan_vector, idx_t count) {
	auto &state = state_p.Cast<FSSTCompressionState>();

	// Get vector data
	UnifiedVectorFormat vdata;
	scan_vector.ToUnifiedFormat(count, vdata);
	auto data = UnifiedVectorFormat::GetData<string_t>(vdata);

	// Collect pointers to strings to compress
	vector<size_t> sizes_in;
	vector<unsigned char *> strings_in;
	size_t total_size = 0;
	idx_t total_count = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);

		// Note: we treat nulls and empty strings the same
		if (!vdata.validity.RowIsValid(idx) || data[idx].GetSize() == 0) {
			continue;
		}

		total_count++;
		total_size += data[idx].GetSize();
		sizes_in.push_back(data[idx].GetSize());
		strings_in.push_back((unsigned char *)data[idx].GetData()); // NOLINT
	}

	// Only Nulls or empty strings in this vector, nothing to compress
	if (total_count == 0) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = vdata.sel->get_index(i);
			if (!vdata.validity.RowIsValid(idx)) {
				state.AddNull();
			} else if (data[idx].GetSize() == 0) {
				state.AddEmptyString();
			} else {
				throw FatalException("FSST: no encoder found even though there are values to encode");
			}
		}
		return;
	}

	// Compress buffers
	size_t compress_buffer_size = MaxValue<size_t>(total_size * 2 + 7, 1);
	vector<unsigned char *> strings_out(total_count, nullptr);
	vector<size_t> sizes_out(total_count, 0);
	vector<unsigned char> compress_buffer(compress_buffer_size, 0);

	auto res = duckdb_fsst_compress(
	    state.fsst_encoder,   /* IN: encoder obtained from duckdb_fsst_create(). */
	    total_count,          /* IN: number of strings in batch to compress. */
	    &sizes_in[0],         /* IN: byte-lengths of the inputs */
	    &strings_in[0],       /* IN: input string start pointers. */
	    compress_buffer_size, /* IN: byte-length of output buffer. */
	    &compress_buffer[0],  /* OUT: memory buffer to put the compressed strings in (one after the other). */
	    &sizes_out[0],        /* OUT: byte-lengths of the compressed strings. */
	    &strings_out[0]       /* OUT: output string start pointers. Will all point into [output,output+size). */
	);

	if (res != total_count) {
		throw FatalException("FSST compression failed to compress all strings");
	}

	// Push the compressed strings to the compression state one by one
	idx_t compressed_idx = 0;
	for (idx_t i = 0; i < count; i++) {
		auto idx = vdata.sel->get_index(i);
		if (!vdata.validity.RowIsValid(idx)) {
			state.AddNull();
		} else if (data[idx].GetSize() == 0) {
			state.AddEmptyString();
		} else {
			state.UpdateState(data[idx], strings_out[compressed_idx], sizes_out[compressed_idx]);
			compressed_idx++;
		}
	}
}